

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O0

Bit32u __thiscall MT32Emu::LA32WaveGenerator::getSampleStep(LA32WaveGenerator *this)

{
  Bit16u BVar1;
  Bit32u sampleStep;
  LA32WaveGenerator *this_local;
  
  BVar1 = LA32Utilites::interpolateExp((this->pitch ^ 0xffff) & 0xfff);
  return ((uint)BVar1 << (sbyte)((int)(uint)this->pitch >> 0xc)) >> 8 & 0xfffffffe;
}

Assistant:

Bit32u LA32WaveGenerator::getSampleStep() {
	// sampleStep = EXP2F(pitch / 4096.0f + 4.0f)
	Bit32u sampleStep = LA32Utilites::interpolateExp(~pitch & 4095);
	sampleStep <<= pitch >> 12;
	sampleStep >>= 8;
	sampleStep &= ~1;
	return sampleStep;
}